

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O2

void __thiscall myvk::FrameManager::recreate_swapchain(FrameManager *this)

{
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *this_00;
  GLFWwindow *handle;
  pointer psVar1;
  __shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<myvk::Fence> *i;
  pointer psVar2;
  ulong uVar3;
  long lVar4;
  int height;
  int width;
  __shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2> *local_50;
  
  local_50 = &(this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
  handle = ((((((this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_present_queue_ptr).
              super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_surface_ptr).super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_window;
  width = 0;
  height = 0;
  glfwGetFramebufferSize(handle,&width,&height);
  while ((width == 0 || (height == 0))) {
    glfwGetFramebufferSize(handle,&width,&height);
    glfwWaitEvents();
  }
  psVar1 = (this->m_frame_fences).
           super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->m_frame_fences).
                super__Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this_01 = local_50, psVar2 != psVar1;
      psVar2 = psVar2 + 1) {
    Fence::Wait((psVar2->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                0xffffffffffffffff);
  }
  Swapchain::Create((Swapchain *)&stack0xffffffffffffffb8,(Ptr<Swapchain> *)local_50);
  std::__shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffb8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  SwapchainImage::Create
            ((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
              *)&stack0xffffffffffffffb8,(Ptr<Swapchain> *)this_01);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::_M_move_assign(&this->m_swapchain_images,
                   (vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                    *)&stack0xffffffffffffffb8);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *)&stack0xffffffffffffffb8);
  this_00 = &this->m_swapchain_image_views;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::clear(this_00);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::resize(this_00,(ulong)((this->m_swapchain).
                           super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          m_image_count);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < local_50->_M_ptr->m_image_count; uVar3 = uVar3 + 1) {
    ImageView::Create((ImageView *)&stack0xffffffffffffffb8,
                      (Ptr<SwapchainImage> *)
                      ((long)&(((this->m_swapchain_images).
                                super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar4));
    std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this_00->
                         super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               lVar4),(__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)
                      &stack0xffffffffffffffb8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void FrameManager::recreate_swapchain() {
	GLFWwindow *window = m_swapchain->GetPresentQueuePtr()->GetSurfacePtr()->GetGlfwWindow();
	int width = 0, height = 0;
	glfwGetFramebufferSize(window, &width, &height);
	while (width == 0 || height == 0) {
		glfwGetFramebufferSize(window, &width, &height);
		glfwWaitEvents();
	}

	for (const auto &i : m_frame_fences)
		i->Wait();

	m_swapchain = Swapchain::Create(m_swapchain);
	m_swapchain_images = myvk::SwapchainImage::Create(m_swapchain);
	m_swapchain_image_views.clear();
	m_swapchain_image_views.resize(m_swapchain->GetImageCount());
	for (uint32_t i = 0; i < m_swapchain->GetImageCount(); ++i)
		m_swapchain_image_views[i] = myvk::ImageView::Create(m_swapchain_images[i]);
}